

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O2

void __thiscall
OpenMD::RepulsivePower::getNRepulsionFunc
          (RepulsivePower *this,RealType *r,int *n,RealType *pot,RealType *deriv)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *r;
  dVar2 = pow(1.0 / dVar1,(double)*n);
  *pot = dVar2;
  *deriv = (double)-*n * (1.0 / dVar1) * dVar2;
  return;
}

Assistant:

void RepulsivePower::getNRepulsionFunc(const RealType& r, int& n,
                                         RealType& pot, RealType& deriv) {
    RealType ri   = 1.0 / r;
    RealType rin  = pow(ri, n);
    RealType rin1 = rin * ri;

    pot   = rin;
    deriv = -n * rin1;

    return;
  }